

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetFormattedValue::Run(void)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  string local_1d8 [8];
  string dump2;
  TemplateString local_1b8;
  TemplateString local_198;
  int local_178;
  allocator local_171;
  int i;
  string expected;
  TemplateString local_150;
  string local_130 [8];
  string dump;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetFormattedValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"PRINTF",6);
  ctemplate::TemplateDictionary::SetFormattedValue(local_78,"%s test %04d","template test",1);
  ctemplate::TemplateString::TemplateString(&local_f0,"PRINTF");
  ctemplate::TemplateString::TemplateString(&local_110,"template test test 0001");
  bVar1 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_f0,&local_110);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"PRINTF\", \"template test test 0001\")");
    exit(1);
  }
  std::__cxx11::string::string(local_130);
  ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)local_130);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = strstr(pcVar2,"\n   PRINTF: >template test test 0001<\n");
  if (pcVar2 == (char *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
           ,0xd9,"\n   PRINTF: >template test test 0001<\n",uVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strstr(pcVar2,"\n   PRINTF: >template test test 0001<\n");
    if (pcVar2 != (char *)0x0) {
      exit(1);
    }
    __assert_fail("strstr((dump.c_str()), (\"\\n   PRINTF: >template test test 0001<\\n\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                  ,0xd9,
                  "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
                 );
  }
  ctemplate::TemplateString::TemplateString(&local_150,"PRINTF",6);
  ctemplate::TemplateDictionary::SetFormattedValue(local_78,"%s test %04444d","template test",2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"template test test ",&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  for (local_178 = 0; local_178 < 0x115b; local_178 = local_178 + 1) {
    std::__cxx11::string::append((char *)&i);
  }
  std::__cxx11::string::append((char *)&i);
  ctemplate::TemplateString::TemplateString(&local_198,"PRINTF");
  ctemplate::TemplateString::TemplateString(&local_1b8,(string *)&i);
  bVar1 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_a0,&local_198,&local_1b8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"PRINTF\", expected)");
    exit(1);
  }
  std::__cxx11::string::string(local_1d8);
  ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"\n   PRINTF: >",&local_239);
  std::operator+(local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"<\n",&local_261);
  std::operator+(local_1f8,local_218);
  std::__cxx11::string::operator=((string *)&i,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar2 = strstr(pcVar2,pcVar4);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string(local_130);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  uVar3 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
         ,0xe6,uVar3,uVar5);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar2 = strstr(pcVar2,pcVar4);
  if (pcVar2 != (char *)0x0) {
    exit(1);
  }
  __assert_fail("strstr((dump2.c_str()), (expected.c_str()))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                ,0xe6,
                "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
               );
}

Assistant:

TEST(TemplateDictionary, SetFormattedValue) {
  TemplateDictionary dict("test_SetFormattedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04d", "template test", 1);

  EXPECT_TRUE(peer.ValueIs("PRINTF", "template test test 0001"));
  string dump;
  dict.DumpToString(&dump);
  ASSERT_STRSTR(dump.c_str(), "\n   PRINTF: >template test test 0001<\n");

  // Now test something of size 4k or so, where we can't use scratchbuf
  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04444d", "template test", 2);
  string expected("template test test ");
  for (int i = 0; i < 4443; ++i)
    expected.append("0");
  expected.append("2");
  EXPECT_TRUE(peer.ValueIs("PRINTF", expected));
  string dump2;
  dict.DumpToString(&dump2);
  expected = string("\n   PRINTF: >") + expected + string("<\n");
  ASSERT_STRSTR(dump2.c_str(), expected.c_str());
}